

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O1

RealType __thiscall OpenMD::NPTi::calcConservedQuantity(NPTi *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  int iVar3;
  SimInfo *this_01;
  double dVar4;
  double dVar5;
  int iVar6;
  RealType RVar7;
  RealType RVar8;
  undefined1 auVar9 [16];
  pair<double,_double> pVar10;
  double local_38;
  double dStack_30;
  
  pVar10 = Snapshot::getThermostat
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  (this->super_NPT).thermostat = pVar10;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_01 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPT).NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  iVar3 = this_01->ndf_;
  iVar6 = SimInfo::getFdf(this_01);
  (this->super_NPT).fkBT = (double)(iVar3 - iVar6) * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar7 = Thermo::getTotalEnergy(this_00);
  dVar4 = (this->super_NPT).fkBT;
  dVar5 = (this->super_NPT).tt2;
  dVar1 = (this->super_NPT).thermostat.first;
  auVar9._0_8_ = dVar4 * (this->super_NPT).thermostat.second;
  auVar9._8_8_ = (this->super_NPT).NkBT * 3.0 * (this->super_NPT).tb2 * this->eta * this->eta;
  auVar9 = divpd(auVar9,_DAT_0029b040);
  dVar2 = (this->super_NPT).targetPressure;
  RVar8 = Thermo::getVolume(this_00);
  local_38 = auVar9._0_8_;
  dStack_30 = auVar9._8_8_;
  return ((RVar8 * dVar2) / 163882576.0) / 0.0004184 +
         dStack_30 + (dVar5 * dVar4 * dVar1 * dVar1) / 0.0008368 + RVar7 + local_38;
}

Assistant:

RealType NPTi::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();
    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType Energy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;

    Energy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    barostat_kinetic =
        3.0 * NkBT * tb2 * eta * eta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = Energy + thermostat_kinetic + thermostat_potential +
                        barostat_kinetic + barostat_potential;

    return conservedQuantity;
  }